

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O1

void StoreDataWithHuffmanCodes
               (uint8_t *input,size_t start_pos,size_t mask,Command *commands,size_t n_commands,
               uint8_t *lit_depth,uint16_t *lit_bits,uint8_t *cmd_depth,uint16_t *cmd_bits,
               uint8_t *dist_depth,uint16_t *dist_bits,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  size_t sVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  
  if (n_commands != 0) {
    sVar13 = 0;
    do {
      uVar2 = commands[sVar13].cmd_prefix_;
      bVar1 = cmd_depth[uVar2];
      if (cmd_bits[uVar2] >> (bVar1 & 0x3f) != 0) {
LAB_0011839c:
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < bVar1) {
LAB_0011837d:
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      uVar12 = commands[sVar13].insert_len_;
      uVar7 = (ulong)uVar12;
      uVar8 = commands[sVar13].copy_len_;
      uVar4 = commands[sVar13].dist_extra_;
      uVar3 = commands[sVar13].dist_prefix_;
      uVar9 = *storage_ix;
      uVar10 = bVar1 + uVar9;
      *(ulong *)(storage + (uVar9 >> 3)) =
           (ulong)cmd_bits[uVar2] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
      *storage_ix = uVar10;
      uVar16 = uVar12;
      if (5 < uVar12) {
        if (uVar12 < 0x82) {
          uVar16 = 0x1f;
          uVar6 = (uint)(uVar7 - 2);
          if (uVar6 != 0) {
            for (; uVar6 >> uVar16 == 0; uVar16 = uVar16 - 1) {
            }
          }
          uVar16 = (uVar16 ^ 0xffffffe0) * 2 +
                   (int)(uVar7 - 2 >> ((char)(uVar16 ^ 0xffffffe0) + 0x1fU & 0x3f)) + 0x40;
        }
        else if (uVar12 < 0x842) {
          uVar16 = 0x1f;
          if (uVar12 - 0x42 != 0) {
            for (; uVar12 - 0x42 >> uVar16 == 0; uVar16 = uVar16 - 1) {
            }
          }
          uVar16 = (uVar16 ^ 0xffffffe0) + 0x2a;
        }
        else {
          uVar16 = 0x15;
          if (0x1841 < uVar12) {
            uVar16 = 0x17 - (uVar12 < 0x5842);
          }
        }
      }
      uVar6 = uVar8 & 0xffffff;
      uVar8 = uVar8 >> 0x18 ^ uVar6;
      if (uVar8 < 10) {
        uVar14 = uVar8 + 0xfffe;
      }
      else if (uVar8 < 0x86) {
        uVar14 = 0x1f;
        uVar11 = (uint)((ulong)uVar8 - 6);
        if (uVar11 != 0) {
          for (; uVar11 >> uVar14 == 0; uVar14 = uVar14 - 1) {
          }
        }
        uVar14 = (uVar14 ^ 0xffffffe0) * 2 +
                 (int)((ulong)uVar8 - 6 >> ((char)(uVar14 ^ 0xffffffe0) + 0x1fU & 0x3f)) + 0x42;
      }
      else {
        uVar14 = 0x17;
        if (uVar8 < 0x846) {
          uVar14 = 0x1f;
          if (uVar8 - 0x46 != 0) {
            for (; uVar8 - 0x46 >> uVar14 == 0; uVar14 = uVar14 - 1) {
            }
          }
          uVar14 = (uVar14 ^ 0xffffffe0) + 0x2c;
        }
      }
      uVar9 = (ulong)((uVar16 & 0xffff) << 2);
      iVar5 = *(int *)((long)kInsExtra + uVar9);
      uVar15 = (ulong)((uVar14 & 0xffff) << 2);
      uVar9 = (ulong)(uVar8 - *(int *)((long)kCopyBase + uVar15)) << ((byte)iVar5 & 0x3f) |
              (ulong)(uVar12 - *(int *)((long)kInsBase + uVar9));
      uVar12 = iVar5 + *(int *)((long)kCopyExtra + uVar15);
      if (uVar9 >> ((byte)uVar12 & 0x3f) != 0) goto LAB_0011839c;
      if (0x38 < uVar12) goto LAB_0011837d;
      *(ulong *)(storage + (uVar10 >> 3)) =
           uVar9 << ((byte)uVar10 & 7) | (ulong)storage[uVar10 >> 3];
      *storage_ix = uVar12 + uVar10;
      if (uVar7 != 0) {
        uVar9 = *storage_ix;
        do {
          bVar1 = lit_depth[input[start_pos & mask]];
          if (lit_bits[input[start_pos & mask]] >> (bVar1 & 0x3f) != 0) goto LAB_0011839c;
          if (0x38 < bVar1) goto LAB_0011837d;
          *(ulong *)(storage + (uVar9 >> 3)) =
               (ulong)lit_bits[input[start_pos & mask]] << ((byte)uVar9 & 7) |
               (ulong)storage[uVar9 >> 3];
          uVar9 = uVar9 + bVar1;
          *storage_ix = uVar9;
          start_pos = start_pos + 1;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      if ((uVar6 != 0) && (0x7f < uVar2)) {
        bVar1 = dist_depth[uVar3];
        if (dist_bits[uVar3] >> (bVar1 & 0x3f) != 0) goto LAB_0011839c;
        if (0x38 < bVar1) goto LAB_0011837d;
        uVar9 = *storage_ix;
        uVar7 = bVar1 + uVar9;
        *(ulong *)(storage + (uVar9 >> 3)) =
             (ulong)dist_bits[uVar3] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
        *storage_ix = uVar7;
        if ((uVar4 & 0xffffff) >> ((byte)(uVar4 >> 0x18) & 0x3f) != 0) goto LAB_0011839c;
        if (0x38ffffff < uVar4) goto LAB_0011837d;
        *(ulong *)(storage + (uVar7 >> 3)) =
             (ulong)(uVar4 & 0xffffff) << ((byte)uVar7 & 7) | (ulong)storage[uVar7 >> 3];
        *storage_ix = (uVar4 >> 0x18) + uVar7;
      }
      start_pos = start_pos + uVar6;
      sVar13 = sVar13 + 1;
    } while (sVar13 != n_commands);
  }
  return;
}

Assistant:

static void StoreDataWithHuffmanCodes(const uint8_t* input,
                                      size_t start_pos,
                                      size_t mask,
                                      const Command *commands,
                                      size_t n_commands,
                                      const uint8_t* lit_depth,
                                      const uint16_t* lit_bits,
                                      const uint8_t* cmd_depth,
                                      const uint16_t* cmd_bits,
                                      const uint8_t* dist_depth,
                                      const uint16_t* dist_bits,
                                      size_t* storage_ix,
                                      uint8_t* storage) {
  size_t pos = start_pos;
  size_t i;
  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    const size_t cmd_code = cmd.cmd_prefix_;
    size_t j;
    BrotliWriteBits(
        cmd_depth[cmd_code], cmd_bits[cmd_code], storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    for (j = cmd.insert_len_; j != 0; --j) {
      const uint8_t literal = input[pos & mask];
      BrotliWriteBits(
          lit_depth[literal], lit_bits[literal], storage_ix, storage);
      ++pos;
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd) && cmd.cmd_prefix_ >= 128) {
      const size_t dist_code = cmd.dist_prefix_;
      const uint32_t distnumextra = cmd.dist_extra_ >> 24;
      const uint32_t distextra = cmd.dist_extra_ & 0xffffff;
      BrotliWriteBits(dist_depth[dist_code], dist_bits[dist_code],
                      storage_ix, storage);
      BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
    }
  }
}